

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphFileOperations.hpp
# Opt level: O1

graphProperties *
floorplan::GraphFileOperations::loadGraphFromXML
          (graphProperties *__return_storage_ptr__,string *filenamePath,floorplanGraph *outGraph,
          string *rootNodeName)

{
  size_t *psVar1;
  uint *puVar2;
  Point2D *pPVar3;
  long *plVar4;
  pointer pcVar5;
  boost *this;
  vertex_descriptor u;
  size_type sVar6;
  size_type sVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  long lVar11;
  self_type *psVar12;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  mapped_type *ppvVar15;
  const_iterator cVar16;
  boost *pbVar17;
  ulong uVar18;
  size_type __n;
  undefined8 *puVar19;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar20;
  undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>
  *in_R9;
  OutEdgeList *el;
  ulong uVar21;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar22;
  bool bVar23;
  pair<bool,_void_*> pVar24;
  char *endptr;
  string spaceName;
  graphProperties *currentGraphProperty;
  string spaceType;
  vector<Point2D,_std::allocator<Point2D>_> points;
  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
  *g;
  ptree XMLtree;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  nameToVertex;
  LineSegment local_668;
  char *local_608;
  string local_600;
  graphProperties *local_5e0;
  string local_5d8;
  vector<Point2D,_std::allocator<Point2D>_> local_5b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_5a0;
  floorplanGraph *local_598;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_578;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f0;
  string *local_3e8;
  StoredVertexList *local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3d8;
  Point2D local_3d0;
  string local_3c0;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  local_378;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  
  local_3a0.m_data._M_dataplus._M_p = (pointer)&local_3a0.m_data.field_2;
  local_3a0.m_data._M_string_length = 0;
  local_3a0.m_data.field_2._M_local_buf[0] = '\0';
  local_5e0 = __return_storage_ptr__;
  local_598 = outGraph;
  pvVar9 = operator_new(0x20);
  pvVar10 = operator_new(0x70);
  *(void **)((long)pvVar9 + 8) = pvVar10;
  *(undefined8 *)((long)pvVar10 + 0x48) = 0;
  *(long *)((long)pvVar10 + 0x50) = (long)pvVar10 + 0x48;
  *(long *)((long)pvVar10 + 0x58) = (long)pvVar10 + 0x48;
  *(long *)((long)pvVar10 + 0x68) = (long)pvVar10 + 0x60;
  *(long *)((long)pvVar10 + 0x60) = (long)pvVar10 + 0x60;
  *(undefined8 *)((long)pvVar9 + 0x18) = 0;
  local_3a0.m_children = pvVar9;
  std::locale::locale((locale *)&local_668);
  boost::property_tree::xml_parser::
  read_xml<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            (filenamePath,&local_3a0,0,(locale *)&local_668);
  std::locale::~locale((locale *)&local_668);
  local_378._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_378._M_impl.super__Rb_tree_header._M_header;
  local_378._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_378._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_378._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3f0 = &(local_5e0->floorname).field_2;
  (local_5e0->floorname)._M_dataplus._M_p = (pointer)local_3f0;
  (local_5e0->floorname)._M_string_length = 0;
  (local_5e0->floorname).field_2._M_local_buf[0] = '\0';
  (local_5e0->filepath)._M_dataplus._M_p = (pointer)&(local_5e0->filepath).field_2;
  (local_5e0->filepath)._M_string_length = 0;
  (local_5e0->filepath).field_2._M_local_buf[0] = '\0';
  (local_5e0->centroid).x = -1.0;
  (local_5e0->centroid).y = -1.0;
  local_5e0->maxx = -1.0;
  local_5e0->maxy = -1.0;
  local_5e0->minx = -1.0;
  local_5e0->miny = -1.0;
  local_378._M_impl.super__Rb_tree_header._M_header._M_right =
       local_378._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_assign((string *)&local_5e0->filepath);
  lVar11 = std::__cxx11::string::rfind((char)filenamePath,0x2f);
  if (lVar11 == -1) {
    std::__cxx11::string::_M_assign((string *)local_5e0);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_668,(ulong)filenamePath);
    std::__cxx11::string::operator=((string *)local_5e0,(string *)&local_668);
    if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
      operator_delete((void *)local_668.startPos.x,
                      CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) + 1);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,(rootNodeName->_M_dataplus)._M_p,(allocator<char> *)&local_600);
  local_668.type._M_dataplus._M_p._0_1_ = 0x2e;
  local_668.type._M_string_length = (size_type)local_668.startPos.x;
  local_3e8 = rootNodeName;
  psVar12 = boost::property_tree::
            basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::get_child(&local_3a0,(path_type *)&local_668);
  if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
    operator_delete((void *)local_668.startPos.x,
                    CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) + 1);
  }
  ppVar22 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              **)((long)psVar12->m_children + 8);
  pcVar5 = ppVar22[1].second.m_data._M_dataplus._M_p;
  ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(pcVar5 + -0x60);
  if (pcVar5 == (pointer)0x0) {
    ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x0;
  }
  if (ppVar20 != ppVar22) {
    local_3e0 = &(local_598->super_type).m_vertices;
    local_3d8 = ppVar22;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,(ppVar20->first)._M_dataplus._M_p,
                 (allocator<char> *)&local_600);
      iVar8 = std::__cxx11::string::compare((char *)&local_668);
      if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
        operator_delete((void *)local_668.startPos.x,
                        CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) + 1);
      }
      if (iVar8 == 0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pair(&local_78,ppVar20);
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"name","");
        GetAttr(&local_600,&local_78,&local_410);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        boost::property_tree::
        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~basic_ptree(&local_78.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
          operator_delete(local_78.first._M_dataplus._M_p,
                          local_78.first.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pair(&local_c0,ppVar20);
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"type","");
        GetAttr(&local_5d8,&local_c0,&local_430);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        boost::property_tree::
        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~basic_ptree(&local_c0.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.first._M_dataplus._M_p != &local_c0.first.field_2) {
          operator_delete(local_c0.first._M_dataplus._M_p,
                          local_c0.first.field_2._M_allocated_capacity + 1);
        }
        lVar11 = std::__cxx11::string::find('\0',0x2e);
        if (lVar11 != -1) {
          std::__cxx11::string::substr((ulong)&local_668,(ulong)&local_600);
          std::__cxx11::string::operator=((string *)&local_600,(string *)&local_668);
          if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
            operator_delete((void *)local_668.startPos.x,
                            CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) + 1);
          }
        }
        local_5a0 = ppVar20;
        if (local_600._M_string_length != 0) {
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c0,local_600._M_dataplus._M_p,
                     local_600._M_dataplus._M_p + local_600._M_string_length);
          pVar24 = GraphUtils::doesVertexExists(&local_3c0,local_598);
          p_Var13 = (_List_node_base *)pVar24.second;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
          }
          if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            p_Var13 = (_List_node_base *)operator_new(0xa8);
            p_Var13->_M_prev = p_Var13;
            p_Var13->_M_next = p_Var13;
            p_Var13[1]._M_next = (_List_node_base *)0x0;
            p_Var13[1]._M_prev = (_List_node_base *)&p_Var13[2]._M_prev;
            p_Var13[2]._M_next = (_List_node_base *)0x0;
            *(undefined1 *)&p_Var13[2]._M_prev = 0;
            p_Var13[3]._M_prev = (_List_node_base *)&p_Var13[4]._M_prev;
            p_Var13[4]._M_next = (_List_node_base *)0x0;
            *(undefined1 *)&p_Var13[4]._M_prev = 0;
            p_Var13[5]._M_prev = (_List_node_base *)0x0;
            p_Var13[6]._M_next = (_List_node_base *)0x0;
            p_Var13[6]._M_prev = (_List_node_base *)0x0;
            p_Var13[9]._M_next = (_List_node_base *)0xbff0000000000000;
            p_Var13[9]._M_prev = (_List_node_base *)0xbff0000000000000;
            p_Var13[10]._M_next = (_List_node_base *)0x0;
            p_Var14 = (_List_node_base *)operator_new(0x18);
            p_Var14[1]._M_next = p_Var13;
            std::__detail::_List_node_base::_M_hook(p_Var14);
            psVar1 = &(local_598->super_type).m_vertices.
                      super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            p_Var13[10]._M_next =
                 (local_598->super_type).m_vertices.
                 super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                 super__List_node_base._M_prev;
            std::__cxx11::string::_M_assign((string *)&p_Var13[1]._M_prev);
            std::__cxx11::string::_M_assign((string *)&p_Var13[3]._M_prev);
            ppvVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                     *)&local_378,&local_600);
            *ppvVar15 = p_Var13;
          }
          local_580 = *(undefined8 **)((long)(local_5a0->second).m_children + 8);
          puVar19 = (undefined8 *)(local_580[0xd] + -0x60);
          if (local_580[0xd] == 0) {
            puVar19 = (undefined8 *)0x0;
          }
          if (puVar19 != local_580) {
            local_590 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&p_Var13[5]._M_prev;
            do {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_668,(char *)*puVar19,(allocator<char> *)&local_570);
              iVar8 = std::__cxx11::string::compare((char *)&local_668);
              if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
                operator_delete((void *)local_668.startPos.x,
                                CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) + 1);
              }
              if (iVar8 == 0) {
                local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                super__Vector_impl_data._M_start = (Point2D *)0x0;
                local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                super__Vector_impl_data._M_finish = (Point2D *)0x0;
                local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (Point2D *)0x0;
                local_578 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              **)(puVar19[8] + 8);
                pcVar5 = local_578[1].second.m_data._M_dataplus._M_p;
                ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(pcVar5 + -0x60);
                if (pcVar5 == (pointer)0x0) {
                  ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)0x0;
                }
                if (ppVar20 != local_578) {
                  do {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_668,(ppVar20->first)._M_dataplus._M_p,
                               (allocator<char> *)&local_570);
                    iVar8 = std::__cxx11::string::compare((char *)&local_668);
                    if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
                      operator_delete((void *)local_668.startPos.x,
                                      CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) +
                                      1);
                    }
                    pPVar3 = &local_668.endPos;
                    if (iVar8 == 0) {
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_108,ppVar20);
                      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"x","");
                      GetAttr((string *)&local_668,&local_108,&local_450);
                      p_Var14 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var13[9]._M_next = p_Var14;
                      if ((Point2D *)local_668.startPos.x != pPVar3) {
                        operator_delete((void *)local_668.startPos.x,
                                        CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_)
                                        + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_450._M_dataplus._M_p != &local_450.field_2) {
                        operator_delete(local_450._M_dataplus._M_p,
                                        local_450.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_108.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108.first._M_dataplus._M_p != &local_108.first.field_2) {
                        operator_delete(local_108.first._M_dataplus._M_p,
                                        local_108.first.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_150,ppVar20);
                      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"y","");
                      GetAttr((string *)&local_668,&local_150,&local_470);
                      p_Var14 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var13[9]._M_prev = p_Var14;
                      if ((Point2D *)local_668.startPos.x != pPVar3) {
                        operator_delete((void *)local_668.startPos.x,
                                        CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_)
                                        + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_470._M_dataplus._M_p != &local_470.field_2) {
                        operator_delete(local_470._M_dataplus._M_p,
                                        local_470.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_150.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_150.first._M_dataplus._M_p != &local_150.first.field_2) {
                        operator_delete(local_150.first._M_dataplus._M_p,
                                        local_150.first.field_2._M_allocated_capacity + 1);
                      }
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_668,(ppVar20->first)._M_dataplus._M_p,
                               (allocator<char> *)&local_570);
                    iVar8 = std::__cxx11::string::compare((char *)&local_668);
                    if ((Point2D *)local_668.startPos.x != pPVar3) {
                      operator_delete((void *)local_668.startPos.x,
                                      CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) +
                                      1);
                    }
                    pPVar3 = &local_668.endPos;
                    if (iVar8 == 0) {
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_198,ppVar20);
                      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_490,"maxx","");
                      GetAttr((string *)&local_668,&local_198,&local_490);
                      p_Var14 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var13[7]._M_next = p_Var14;
                      if ((Point2D *)local_668.startPos.x != pPVar3) {
                        operator_delete((void *)local_668.startPos.x,
                                        CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_)
                                        + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_490._M_dataplus._M_p != &local_490.field_2) {
                        operator_delete(local_490._M_dataplus._M_p,
                                        local_490.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_198.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_198.first._M_dataplus._M_p != &local_198.first.field_2) {
                        operator_delete(local_198.first._M_dataplus._M_p,
                                        local_198.first.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_1e0,ppVar20);
                      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_4b0,"maxy","");
                      GetAttr((string *)&local_668,&local_1e0,&local_4b0);
                      p_Var14 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var13[7]._M_prev = p_Var14;
                      if ((Point2D *)local_668.startPos.x != pPVar3) {
                        operator_delete((void *)local_668.startPos.x,
                                        CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_)
                                        + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                        operator_delete(local_4b0._M_dataplus._M_p,
                                        local_4b0.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_1e0.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e0.first._M_dataplus._M_p != &local_1e0.first.field_2) {
                        operator_delete(local_1e0.first._M_dataplus._M_p,
                                        local_1e0.first.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_228,ppVar20);
                      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_4d0,"minx","");
                      GetAttr((string *)&local_668,&local_228,&local_4d0);
                      p_Var14 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var13[8]._M_next = p_Var14;
                      if ((Point2D *)local_668.startPos.x != pPVar3) {
                        operator_delete((void *)local_668.startPos.x,
                                        CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_)
                                        + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                        operator_delete(local_4d0._M_dataplus._M_p,
                                        local_4d0.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_228.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
                        operator_delete(local_228.first._M_dataplus._M_p,
                                        local_228.first.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_270,ppVar20);
                      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_4f0,"miny","");
                      GetAttr((string *)&local_668,&local_270,&local_4f0);
                      p_Var14 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var13[8]._M_prev = p_Var14;
                      if ((Point2D *)local_668.startPos.x != pPVar3) {
                        operator_delete((void *)local_668.startPos.x,
                                        CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_)
                                        + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
                        operator_delete(local_4f0._M_dataplus._M_p,
                                        local_4f0.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_270.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_270.first._M_dataplus._M_p != &local_270.first.field_2) {
                        operator_delete(local_270.first._M_dataplus._M_p,
                                        local_270.first.field_2._M_allocated_capacity + 1);
                      }
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_668,(ppVar20->first)._M_dataplus._M_p,
                               (allocator<char> *)&local_570);
                    iVar8 = std::__cxx11::string::compare((char *)&local_668);
                    if ((Point2D *)local_668.startPos.x != pPVar3) {
                      operator_delete((void *)local_668.startPos.x,
                                      CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) +
                                      1);
                    }
                    if (iVar8 == 0) {
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_2b8,ppVar20);
                      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"x","");
                      GetAttr((string *)&local_668,&local_2b8,&local_510);
                      local_588 = (undefined8 *)strtod((char *)local_668.startPos.x,&local_608);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_300,ppVar20);
                      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"y","");
                      GetAttr(&local_570,&local_300,&local_530);
                      local_3d0.y = strtod(local_570._M_dataplus._M_p,&local_608);
                      local_3d0.x = (double)local_588;
                      if (local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<Point2D,_std::allocator<Point2D>_>::_M_realloc_insert<Point2D>
                                  (&local_5b8,
                                   (iterator)
                                   local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_3d0);
                      }
                      else {
                        (local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                         super__Vector_impl_data._M_finish)->x = (double)local_588;
                        (local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                         super__Vector_impl_data._M_finish)->y = local_3d0.y;
                        local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_570._M_dataplus._M_p != &local_570.field_2) {
                        operator_delete(local_570._M_dataplus._M_p,
                                        local_570.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_530._M_dataplus._M_p != &local_530.field_2) {
                        operator_delete(local_530._M_dataplus._M_p,
                                        local_530.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_300.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_300.first._M_dataplus._M_p != &local_300.first.field_2) {
                        operator_delete(local_300.first._M_dataplus._M_p,
                                        local_300.first.field_2._M_allocated_capacity + 1);
                      }
                      if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
                        operator_delete((void *)local_668.startPos.x,
                                        CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_)
                                        + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_510._M_dataplus._M_p != &local_510.field_2) {
                        operator_delete(local_510._M_dataplus._M_p,
                                        local_510.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_2b8.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2b8.first._M_dataplus._M_p != &local_2b8.first.field_2) {
                        operator_delete(local_2b8.first._M_dataplus._M_p,
                                        local_2b8.first.field_2._M_allocated_capacity + 1);
                      }
                    }
                    pcVar5 = ppVar20[1].second.m_data._M_dataplus._M_p;
                    ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(pcVar5 + -0x60);
                    if (pcVar5 == (pointer)0x0) {
                      ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)0x0;
                    }
                  } while (ppVar20 != local_578);
                }
                ppVar20 = local_590;
                if (local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  LineSegment::LineSegment(&local_668);
                  if ((long)local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                            super__Vector_impl_data._M_start != 0) {
                    uVar18 = (long)local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 4;
                    lVar11 = 0x10;
                    uVar21 = 0;
                    do {
                      plVar4 = (long *)((long)&local_5b8.
                                               super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                               ._M_impl.super__Vector_impl_data._M_start[-1].x +
                                       lVar11);
                      local_668.startPos.x = (double)*plVar4;
                      local_668.startPos.y = (double)plVar4[1];
                      if (uVar21 == uVar18 - 1) {
                        local_668.endPos.x._0_4_ =
                             *(uint *)&(local_5b8.
                                        super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->x;
                        local_668.endPos.x._4_4_ =
                             *(uint *)((long)&(local_5b8.
                                               super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->x + 4);
                        local_668.endPos.y._0_4_ =
                             *(uint *)&(local_5b8.
                                        super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->y;
                        local_668.endPos.y._4_4_ =
                             *(uint *)((long)&(local_5b8.
                                               super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->y + 4);
                      }
                      else {
                        puVar2 = (uint *)((long)&(local_5b8.
                                                  super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->x +
                                         lVar11);
                        local_668.endPos.x._0_4_ = *puVar2;
                        local_668.endPos.x._4_4_ = puVar2[1];
                        local_668.endPos.y._0_4_ = puVar2[2];
                        local_668.endPos.y._4_4_ = puVar2[3];
                      }
                      std::vector<LineSegment,_std::allocator<LineSegment>_>::push_back
                                ((vector<LineSegment,_std::allocator<LineSegment>_> *)ppVar20,
                                 &local_668);
                      uVar21 = uVar21 + 1;
                      uVar18 = (long)local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      lVar11 = lVar11 + 0x10;
                    } while (uVar21 < uVar18);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_668.portalToRoom._M_dataplus._M_p != &local_668.portalToRoom.field_2)
                  {
                    operator_delete(local_668.portalToRoom._M_dataplus._M_p,
                                    local_668.portalToRoom.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_668.type._M_dataplus._M_p._1_7_,
                                  local_668.type._M_dataplus._M_p._0_1_) != &local_668.type.field_2)
                  {
                    operator_delete((undefined1 *)
                                    CONCAT71(local_668.type._M_dataplus._M_p._1_7_,
                                             local_668.type._M_dataplus._M_p._0_1_),
                                    local_668.type.field_2._M_allocated_capacity + 1);
                  }
                }
                if (local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                    super__Vector_impl_data._M_start != (Point2D *)0x0) {
                  operator_delete(local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_5b8.
                                        super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_5b8.
                                        super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
              }
              plVar4 = puVar19 + 0xd;
              puVar19 = (undefined8 *)(*plVar4 + -0x60);
              if (*plVar4 == 0) {
                puVar19 = (undefined8 *)0x0;
              }
            } while (puVar19 != local_580);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
        }
        ppVar22 = local_3d8;
        ppVar20 = local_5a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p != &local_600.field_2) {
          operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar5 = ppVar20[1].second.m_data._M_dataplus._M_p;
      ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(pcVar5 + -0x60);
      if (pcVar5 == (pointer)0x0) {
        ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x0;
      }
    } while (ppVar20 != ppVar22);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,(local_3e8->_M_dataplus)._M_p,(allocator<char> *)&local_600);
  local_668.type._M_dataplus._M_p._0_1_ = 0x2e;
  local_668.type._M_string_length = (size_type)local_668.startPos.x;
  psVar12 = boost::property_tree::
            basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::get_child(&local_3a0,(path_type *)&local_668);
  if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
    operator_delete((void *)local_668.startPos.x,
                    CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) + 1);
  }
  local_5a0 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                **)((long)psVar12->m_children + 8);
  pcVar5 = local_5a0[1].second.m_data._M_dataplus._M_p;
  ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(pcVar5 + -0x60);
  if (pcVar5 == (pointer)0x0) {
    ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x0;
  }
  if (ppVar20 != local_5a0) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,(ppVar20->first)._M_dataplus._M_p,
                 (allocator<char> *)&local_600);
      iVar8 = std::__cxx11::string::compare((char *)&local_668);
      if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
        operator_delete((void *)local_668.startPos.x,
                        CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) + 1);
      }
      if (iVar8 == 0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pair(&local_348,ppVar20);
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"name","");
        GetAttr(&local_600,&local_348,&local_550);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        boost::property_tree::
        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~basic_ptree(&local_348.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348.first._M_dataplus._M_p != &local_348.first.field_2) {
          operator_delete(local_348.first._M_dataplus._M_p,
                          local_348.first.field_2._M_allocated_capacity + 1);
        }
        lVar11 = std::__cxx11::string::find('\0',0x2e);
        if (lVar11 != -1) {
          std::__cxx11::string::substr((ulong)&local_668,(ulong)&local_600);
          std::__cxx11::string::operator=((string *)&local_600,(string *)&local_668);
          if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
            operator_delete((void *)local_668.startPos.x,
                            CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) + 1);
          }
        }
        local_580 = *(undefined8 **)((long)(ppVar20->second).m_children + 8);
        puVar19 = (undefined8 *)(local_580[0xd] + -0x60);
        if (local_580[0xd] == 0) {
          puVar19 = (undefined8 *)0x0;
        }
        ppVar22 = ppVar20;
        if (puVar19 != local_580) {
          do {
            local_590 = ppVar22;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_668,(char *)*puVar19,(allocator<char> *)&local_5d8);
            local_588 = puVar19;
            iVar8 = std::__cxx11::string::compare((char *)&local_668);
            if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
              operator_delete((void *)local_668.startPos.x,
                              CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) + 1);
            }
            if (iVar8 == 0) {
              local_668.startPos.x = (double)&local_668.endPos;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"<xmlattr>","");
              local_668.type._M_dataplus._M_p._0_1_ = 0x2e;
              local_668.type._M_string_length = (size_type)local_668.startPos.x;
              psVar12 = boost::property_tree::
                        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::get_child((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)(local_588 + 4),(path_type *)&local_668);
              if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
                operator_delete((void *)local_668.startPos.x,
                                CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) + 1);
              }
              local_578 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            **)((long)psVar12->m_children + 8);
              pcVar5 = local_578[1].second.m_data._M_dataplus._M_p;
              ppVar22 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(pcVar5 + -0x60);
              if (pcVar5 == (pointer)0x0) {
                ppVar22 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)0x0;
              }
              if (ppVar22 != local_578) {
                do {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_668,(ppVar22->first)._M_dataplus._M_p,
                             (allocator<char> *)&local_5d8);
                  iVar8 = std::__cxx11::string::compare((char *)&local_668);
                  if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
                    operator_delete((void *)local_668.startPos.x,
                                    CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_) + 1)
                    ;
                  }
                  if (iVar8 == 0) {
                    pcVar5 = (ppVar22->second).m_data._M_dataplus._M_p;
                    local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_5d8,pcVar5,
                               pcVar5 + (ppVar22->second).m_data._M_string_length);
                    lVar11 = std::__cxx11::string::find((char)&local_5d8,0x2e);
                    if (lVar11 != -1) {
                      std::__cxx11::string::substr((ulong)&local_668,(ulong)&local_5d8);
                      std::__cxx11::string::operator=((string *)&local_5d8,(string *)&local_668);
                      if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
                        operator_delete((void *)local_668.startPos.x,
                                        CONCAT44(local_668.endPos.x._4_4_,local_668.endPos.x._0_4_)
                                        + 1);
                      }
                    }
                    cVar16 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                             ::find(&local_378,&local_5d8);
                    if (((_Rb_tree_header *)cVar16._M_node !=
                         &local_378._M_impl.super__Rb_tree_header) &&
                       (cVar16 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                 ::find(&local_378,&local_600),
                       (_Rb_tree_header *)cVar16._M_node != &local_378._M_impl.super__Rb_tree_header
                       )) {
                      ppvVar15 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                               *)&local_378,&local_600);
                      this = (boost *)*ppvVar15;
                      ppvVar15 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                               *)&local_378,&local_5d8);
                      sVar7 = local_5d8._M_string_length;
                      sVar6 = local_600._M_string_length;
                      u = *ppvVar15;
                      for (pbVar17 = *(boost **)this;
                          (pbVar17 != this && (*(vertex_descriptor *)(pbVar17 + 0x10) != u));
                          pbVar17 = *(boost **)pbVar17) {
                      }
                      if (pbVar17 == this) {
                        __n = local_5d8._M_string_length;
                        if (local_600._M_string_length < local_5d8._M_string_length) {
                          __n = local_600._M_string_length;
                        }
                        if (__n == 0) {
                          bVar23 = true;
                        }
                        else {
                          iVar8 = bcmp(local_5d8._M_dataplus._M_p,local_600._M_dataplus._M_p,__n);
                          bVar23 = iVar8 == 0;
                        }
                        ppVar20 = local_590;
                        if (!(bool)(bVar23 & sVar7 == sVar6)) {
                          local_668.startPos.y = 0.0;
                          local_668.endPos.x._0_4_ = local_668.endPos.x._0_4_ & 0xffffff00;
                          local_668.startPos.x = (double)&local_668.endPos;
                          boost::
                          add_edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>
                                    ((pair<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_bool>
                                      *)&local_570,this,u,&local_668,(edge_property_type *)local_598
                                     ,in_R9);
                          ppVar20 = local_590;
                          if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
                            operator_delete((void *)local_668.startPos.x,
                                            CONCAT44(local_668.endPos.x._4_4_,
                                                     local_668.endPos.x._0_4_) + 1);
                            ppVar20 = local_590;
                          }
                        }
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
                      operator_delete(local_5d8._M_dataplus._M_p,
                                      local_5d8.field_2._M_allocated_capacity + 1);
                    }
                  }
                  pcVar5 = ppVar22[1].second.m_data._M_dataplus._M_p;
                  ppVar22 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(pcVar5 + -0x60);
                  if (pcVar5 == (pointer)0x0) {
                    ppVar22 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)0x0;
                  }
                } while (ppVar22 != local_578);
              }
            }
            puVar19 = (undefined8 *)(local_588[0xd] + -0x60);
            if (local_588[0xd] == 0) {
              puVar19 = (undefined8 *)0x0;
            }
            ppVar22 = local_590;
          } while (puVar19 != local_580);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p != &local_600.field_2) {
          operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar5 = ppVar20[1].second.m_data._M_dataplus._M_p;
      ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(pcVar5 + -0x60);
      if (pcVar5 == (pointer)0x0) {
        ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x0;
      }
    } while (ppVar20 != local_5a0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::~_Rb_tree(&local_378);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_3a0);
  return local_5e0;
}

Assistant:

static graphProperties loadGraphFromXML(std::string filenamePath, floorplanGraph& outGraph, std::string rootNodeName){
        ptree XMLtree;
        read_xml(filenamePath, XMLtree);
        map<string, Vertex> nameToVertex;
        graphProperties currentGraphProperty;
        currentGraphProperty.filepath = filenamePath;

        size_t foundDot = filenamePath.find_last_of('/');
        if (foundDot != string::npos)
            currentGraphProperty.floorname = filenamePath.substr(foundDot+1, filenamePath.size()-1);
        else
            currentGraphProperty.floorname = filenamePath;

        BOOST_FOREACH(ptree::value_type &v, XMLtree.get_child(rootNodeName.c_str()))
        {
            if( ((string)v.first.data()).compare("space") == 0 )
            {
                string spaceName = GetAttr(v, "name");
                string spaceType = GetAttr(v, "type");

                size_t foundDot = spaceName.find_first_of('.');
                if (foundDot != string::npos)
                    spaceName = spaceName.substr(0, foundDot);


                if (!spaceName.empty()){
                    pair<bool,Vertex> searchResult =  GraphUtils::doesVertexExists(spaceName, outGraph);
                    Vertex currentVertex;
                    if (!searchResult.first){
                        currentVertex = add_vertex(outGraph);
                        outGraph[currentVertex].category  =  spaceType ;
                        outGraph[currentVertex].vertex_id =  spaceName;
                        nameToVertex[spaceName] = currentVertex;
                    }
                    else {

                        currentVertex = searchResult.second;
                    }
                    // For each space's children
                    BOOST_FOREACH(ptree::value_type &i,
                                  v.second)
                    {
                        if (((string)i.first.data()).compare("contour") == 0){
                            vector<Point2D> points;
                            BOOST_FOREACH(ptree::value_type &l,
                                          i.second)
                            {

                                char* endptr;
                                if( ((string)l.first.data()).compare("centroid") == 0 ){
                                    outGraph[currentVertex].centroid.x = strtod(GetAttr(l, "x").c_str(), &endptr);
                                    outGraph[currentVertex].centroid.y = strtod(GetAttr(l, "y").c_str(), &endptr);
                                }
                                if( ((string)l.first.data()).compare("extent") == 0 ){

                                    outGraph[currentVertex].maxx = strtod(GetAttr(l, "maxx").c_str(), &endptr);
                                    outGraph[currentVertex].maxy = strtod(GetAttr(l, "maxy").c_str(), &endptr);
                                    outGraph[currentVertex].minx = strtod(GetAttr(l, "minx").c_str(), &endptr);
                                    outGraph[currentVertex].miny = strtod(GetAttr(l, "miny").c_str(), &endptr);
                                }
                                if( ((string)l.first.data()).compare("point") == 0 ){
                                    points.push_back(Point2D(strtod(GetAttr(l, "x").c_str(), &endptr), strtod(GetAttr(l, "y").c_str(), &endptr)));
                                }
                            } // for each contour children

                            if(points.size() > 0){
                                LineSegment lsegment;
                                for (int i=0; i < points.size(); i++){
                                    if(i == points.size()-1){
                                        lsegment.startPos = points[i];
                                        lsegment.endPos = points[0];
                                    }
                                    else{
                                        lsegment.startPos = points[i];
                                        lsegment.endPos = points[i+1];
                                    }
                                    outGraph[currentVertex].roomLayout.push_back(lsegment);
                                }
                            }

                        } // if it's a contour

                    } // for each space children
                } // if space with an non-empty name
            } // if space
        }


        // now add edges

        BOOST_FOREACH(ptree::value_type &v, XMLtree.get_child(rootNodeName.c_str()))
        {
            if( ((string)v.first.data()).compare("space") == 0 )
            {
                string sourceSpaceName = GetAttr(v, "name");
                size_t foundDot = sourceSpaceName.find_first_of('.');
                if (foundDot != string::npos)
                    sourceSpaceName = sourceSpaceName.substr(0, foundDot);
                BOOST_FOREACH(ptree::value_type &i,
                              v.second)
                {
                    if( ((string)i.first.data()).compare("portal") == 0 )
                    {

                        BOOST_FOREACH(ptree::value_type &j,
                                      i.second.get_child("<xmlattr>"))
                        {
                            if( ((string)j.first.data()).compare("target") == 0 )
                            {
                                string targetSpaceName = (string)j.second.data();
                                size_t foundDot = targetSpaceName.find_first_of('.');
                                if (foundDot != string::npos)
                                    targetSpaceName = targetSpaceName.substr(0, foundDot);

                                if (nameToVertex.count(targetSpaceName) != 0 && nameToVertex.count(sourceSpaceName) !=  0) {
                                    Vertex v1 = nameToVertex[sourceSpaceName];
                                    Vertex v2 = nameToVertex[targetSpaceName];
                                    pair<Edge, bool> ret = boost::edge(v1, v2, outGraph);
                                    if (!ret.second && targetSpaceName.compare(sourceSpaceName) != 0){
                                        add_edge(v1, v2, outGraph);
                                    } // if edge does not already exists and target,source are not the same
                                } // if both target and source exists in the graph
                            } // if it's a target attribute
                        } // for each portal's attributes
                    } // if this is a portal

                } // for each element of space
            } // if this is a space
        } // Adding edges end

        return currentGraphProperty;
    }